

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Skeleton_blocker_complex.h
# Opt level: O2

bool __thiscall
Gudhi::skeleton_blocker::
Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::contains_edges
          (Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits> *this,
          Simplex *sigma)

{
  bool bVar1;
  _Rb_tree_node_base *p_Var2;
  _Rb_tree_header *p_Var3;
  _Base_ptr p_Var4;
  
  p_Var4 = (sigma->simplex_set)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(sigma->simplex_set)._M_t._M_impl.super__Rb_tree_header;
  while (((_Rb_tree_header *)p_Var4 != p_Var3 &&
         (bVar1 = contains_vertex(this,(Vertex_handle)p_Var4[1]._M_color), p_Var2 = p_Var4, bVar1)))
  {
    while (p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2),
          (_Rb_tree_header *)p_Var2 != p_Var3) {
      bVar1 = contains_edge(this,(Vertex_handle)p_Var4[1]._M_color,(Vertex_handle)p_Var2[1]._M_color
                           );
      if (!bVar1) goto LAB_00111cc8;
    }
    p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
  }
LAB_00111cc8:
  return (_Rb_tree_header *)p_Var4 == p_Var3;
}

Assistant:

bool contains_edges(const Simplex & sigma) const {
    for (auto i = sigma.begin(); i != sigma.end(); ++i) {
      if (!contains_vertex(*i))
        return false;
      for (auto j = i; ++j != sigma.end();) {
        if (!contains_edge(*i, *j))
          return false;
      }
    }
    return true;
  }